

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void duckdb::ConstantVector::SetNull(Vector *vector,bool is_null)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong *puVar3;
  pointer puVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar8;
  pointer this_00;
  type vector_00;
  Vector *vector_01;
  idx_t iVar9;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  pointer this_01;
  undefined7 in_register_00000031;
  idx_t idx;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((int)CONCAT71(in_register_00000031,is_null) == 0) {
    if (puVar2 != (unsigned_long *)0x0) {
      *(byte *)puVar2 = (byte)*puVar2 | 1;
    }
  }
  else {
    if (puVar2 == (unsigned_long *)0x0) {
      local_28 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_38,&local_28);
      p_Var6 = p_Stack_30;
      peVar5 = local_38;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar5;
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    *puVar3 = *puVar3 & 0xfffffffffffffffe;
  }
  if (is_null) {
    PVar1 = (vector->type).physical_type_;
    if (PVar1 == ARRAY) {
      vector_01 = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
      iVar9 = ArrayType::GetSize(&vector->type);
      if (vector_01->vector_type == CONSTANT_VECTOR) {
        SetNull(vector_01,true);
      }
      else if (iVar9 != 0) {
        idx = 0;
        do {
          FlatVector::SetNull(vector_01,idx,true);
          idx = idx + 1;
        } while (iVar9 != idx);
      }
    }
    else if (PVar1 == STRUCT) {
      pvVar8 = StructVector::GetEntries(vector);
      puVar4 = (pvVar8->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_01 = (pvVar8->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar4;
          this_01 = this_01 + 1) {
        this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_01);
        Vector::SetVectorType(this_00,CONSTANT_VECTOR);
        vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_01);
        SetNull(vector_00,true);
      }
    }
  }
  return;
}

Assistant:

void ConstantVector::SetNull(Vector &vector, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	vector.validity.Set(0, !is_null);
	if (is_null) {
		auto &type = vector.GetType();
		auto internal_type = type.InternalType();
		if (internal_type == PhysicalType::STRUCT) {
			// set all child entries to null as well
			auto &entries = StructVector::GetEntries(vector);
			for (auto &entry : entries) {
				entry->SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(*entry, is_null);
			}
		} else if (internal_type == PhysicalType::ARRAY) {
			auto &child = ArrayVector::GetEntry(vector);
			D_ASSERT(child.GetVectorType() == VectorType::CONSTANT_VECTOR ||
			         child.GetVectorType() == VectorType::FLAT_VECTOR);
			auto array_size = ArrayType::GetSize(type);
			if (child.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				D_ASSERT(array_size == 1);
				ConstantVector::SetNull(child, is_null);
			} else {
				for (idx_t i = 0; i < array_size; i++) {
					FlatVector::SetNull(child, i, is_null);
				}
			}
		}
	}
}